

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O0

int hydro_kx_aead_decrypt(hydro_kx_state *state,uint8_t *m,uint8_t *c,size_t clen)

{
  uint32_t uVar1;
  uint8_t *in;
  size_t inlen;
  ulong in_RCX;
  uint8_t *in_RDX;
  void *in_RSI;
  uint32_t cv;
  size_t mlen;
  uint8_t *ct;
  uint8_t *mac;
  uint8_t *aead_state;
  uint8_t k [32];
  uint32_t pub_mac [4];
  uint32_t int_state [12];
  uint8_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint32_t *aead_state_00;
  void *in_stack_ffffffffffffff78;
  hydro_hash_state *in_stack_ffffffffffffff80;
  undefined8 local_68;
  undefined8 local_60;
  uint32_t local_58 [4];
  uint32_t auStack_48 [12];
  void *local_18;
  int local_4;
  
  aead_state_00 = local_58;
  if (in_RCX < 0x10) {
    local_4 = -1;
  }
  else {
    in = in_RDX + 0x10;
    inlen = in_RCX - 0x10;
    local_68 = *(undefined8 *)in_RDX;
    local_60 = *(undefined8 *)(in_RDX + 8);
    local_18 = in_RSI;
    hydro_kx_aead_init((uint8_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48,(hydro_kx_state *)0x106e28);
    hydro_hash_update(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)aead_state_00);
    hydro_kx_aead_xor_dec((uint8_t *)aead_state_00,in_RDX,in,inlen);
    hydro_kx_aead_final((uint8_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    uVar1 = hydro_mem_ct_cmp_u32(auStack_48,(uint32_t *)&local_68,4);
    hydro_mem_ct_zero_u32(local_58,0xc);
    if (uVar1 == 0) {
      local_4 = 0;
    }
    else {
      mem_zero(local_18,inlen);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int
hydro_kx_aead_decrypt(hydro_kx_state *state, uint8_t *m, const uint8_t *c, size_t clen)
{
    _hydro_attr_aligned_(16) uint32_t int_state[gimli_BLOCKBYTES / 4];
    uint32_t                          pub_mac[hydro_kx_AEAD_MACBYTES / 4];
    uint8_t                           k[hydro_kx_AEAD_KEYBYTES];
    uint8_t                          *aead_state = (uint8_t *) (void *) int_state;
    const uint8_t                    *mac;
    const uint8_t                    *ct;
    size_t                            mlen;
    uint32_t                          cv;

    if (clen < hydro_kx_AEAD_MACBYTES) {
        return -1;
    }
    mac  = &c[0];
    ct   = &c[hydro_kx_AEAD_MACBYTES];
    mlen = clen - hydro_kx_AEAD_MACBYTES;
    memcpy(pub_mac, mac, sizeof pub_mac);
    hydro_kx_aead_init(aead_state, k, state);
    hydro_hash_update(&state->h_st, c, clen);
    hydro_kx_aead_xor_dec(aead_state, m, ct, mlen);
    hydro_kx_aead_final(aead_state, k);
    COMPILER_ASSERT(hydro_kx_AEAD_MACBYTES <= gimli_CAPACITY);
    COMPILER_ASSERT(gimli_RATE % 4 == 0);
    cv = hydro_mem_ct_cmp_u32(int_state + gimli_RATE / 4, pub_mac, hydro_kx_AEAD_MACBYTES / 4);
    hydro_mem_ct_zero_u32(int_state, gimli_BLOCKBYTES / 4);
    if (cv != 0) {
        mem_zero(m, mlen);
        return -1;
    }
    return 0;
}